

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgcrypto.hpp
# Opt level: O0

string * ws::wx_decrypt_aes(string *__return_storage_ptr__,string *str_encrypt,string *key)

{
  uchar *puVar1;
  size_type sVar2;
  MsgCryptoError *pMVar3;
  char *__src;
  uchar *puVar4;
  size_type sVar5;
  size_t local_210;
  allocator<char> local_1c1;
  string local_1c0;
  undefined1 local_19c [8];
  AES_KEY aesKey;
  uchar iv [16];
  uchar ckey [32];
  allocator<char> local_51;
  string local_50;
  uchar *local_30;
  uchar *out;
  string *local_20;
  string *key_local;
  string *str_encrypt_local;
  string *result;
  
  out._7_1_ = 0;
  local_20 = key;
  key_local = str_encrypt;
  str_encrypt_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (key_local);
  local_30 = (uchar *)malloc(sVar2);
  if (local_30 == (uchar *)0x0) {
    pMVar3 = (MsgCryptoError *)__cxa_allocate_exception(0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"malloc error",&local_51)
    ;
    MsgCryptoError::MsgCryptoError(pMVar3,&local_50,(source_location)0x276ee8);
    __cxa_throw(pMVar3,&MsgCryptoError::typeinfo,MsgCryptoError::~MsgCryptoError);
  }
  memset(iv + 8,0,0x20);
  memset(aesKey.rd_key + 0x3b,0,0x10);
  __src = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                    (local_20);
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (local_20);
  if (sVar2 < 0x21) {
    local_210 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size(local_20);
  }
  else {
    local_210 = 0x20;
  }
  memcpy(iv + 8,__src,local_210);
  aesKey._236_8_ = iv._8_8_;
  AES_set_decrypt_key(iv + 8,0x100,(AES_KEY *)local_19c);
  puVar4 = (uchar *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::c_str(key_local);
  puVar1 = local_30;
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (key_local);
  AES_cbc_encrypt(puVar4,puVar1,sVar2,(AES_KEY *)local_19c,(uchar *)(aesKey.rd_key + 0x3b),0);
  puVar1 = local_30;
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (key_local);
  puVar4 = local_30;
  if ((puVar1[sVar2 - 1] != '\0') &&
     (sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        (key_local), puVar4[sVar2 - 1] < 0x21)) {
    sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (key_local);
    puVar1 = local_30;
    sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (key_local);
    puVar4 = local_30;
    if (sVar2 != puVar1[sVar5 - 1]) {
      sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        (key_local);
      puVar1 = local_30;
      sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        (key_local);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,(char *)puVar4,sVar2 - puVar1[sVar5 - 1]);
      free(local_30);
      return __return_storage_ptr__;
    }
  }
  pMVar3 = (MsgCryptoError *)__cxa_allocate_exception(0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"wx_decrypt_aes failed.",&local_1c1);
  MsgCryptoError::MsgCryptoError(pMVar3,&local_1c0,(source_location)0x276f00);
  __cxa_throw(pMVar3,&MsgCryptoError::typeinfo,MsgCryptoError::~MsgCryptoError);
}

Assistant:

std::string wx_decrypt_aes(const std::string &str_encrypt, const std::string &key)
  {
    std::string result;
  
  
    auto out = (unsigned char *) malloc(str_encrypt.size());
    if (out == nullptr)
    {
      throw MsgCryptoError("malloc error");
    }
  
    unsigned char ckey[32] = {0};
    unsigned char iv[16] = {0};
    memcpy(ckey, key.c_str(), key.size() > 32 ? 32 : key.size());
    //memcpy(iv, ckey, sizeof(iv) < sizeof(ckey) ? sizeof(iv) : sizeof(ckey));
    memcpy(iv, ckey, sizeof(iv));
    
    AES_KEY aesKey;
    AES_set_decrypt_key(ckey, 8 * 32, &aesKey);
    AES_cbc_encrypt((unsigned char *) str_encrypt.c_str(), out, str_encrypt.size(), &aesKey, iv, AES_DECRYPT);
    if (out[str_encrypt.size() - 1] > 0 && out[str_encrypt.size() - 1] <= 32 &&
        (str_encrypt.size() - out[str_encrypt.size() - 1]) > 0)
      result.append((char *) out, str_encrypt.size() - out[str_encrypt.size() - 1]);
    else
    {
      throw MsgCryptoError("wx_decrypt_aes failed.");
    }
  
    free(out);
    return result;
  }